

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcppLibrary.hpp
# Opt level: O0

void __thiscall tcpp::Lexer::PushStream(Lexer *this,TInputStreamUniquePtr *stream)

{
  bool bVar1;
  TInputStreamUniquePtr *stream_local;
  Lexer *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)stream);
  if (bVar1) {
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)stream);
    if (bVar1) {
      Catch::clara::std::
      stack<std::unique_ptr<tcpp::IInputStream,_std::default_delete<tcpp::IInputStream>_>,_std::deque<std::unique_ptr<tcpp::IInputStream,_std::default_delete<tcpp::IInputStream>_>,_std::allocator<std::unique_ptr<tcpp::IInputStream,_std::default_delete<tcpp::IInputStream>_>_>_>_>
      ::push(&this->mStreamsContext,stream);
    }
    return;
  }
  __assert_fail("stream",
                "/workspace/llm4binary/github/license_c_cmakelists/bnoazx005[P]tcpp/tests/../source/tcppLibrary.hpp"
                ,0x224,"void tcpp::Lexer::PushStream(TInputStreamUniquePtr)");
}

Assistant:

void Lexer::PushStream(TInputStreamUniquePtr stream) TCPP_NOEXCEPT
	{
		TCPP_ASSERT(stream);

		if (!stream)
		{
			return;
		}

		mStreamsContext.push(std::move(stream));
	}